

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char_const(&)[19],kj::String&,char_const(&)[15],kj::String&,char_const(&)[5]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [19],String *params_1,
          char (*params_2) [15],String *params_3,char (*params_4) [5])

{
  char *pcVar1;
  Branch *pBVar2;
  ArrayPtr<const_char> *params_4_00;
  ArrayPtr<const_char> AVar3;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  
  local_58 = toCharSequence<char_const(&)[19]>((char (*) [19])this);
  pcVar1 = *(char **)(*params + 8);
  local_68.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_68.ptr = *(char **)*params;
  }
  local_68.size_ = (size_t)(pcVar1 + -1);
  if (pcVar1 == (char *)0x0) {
    local_68.size_ = (size_t)(char *)0x0;
  }
  AVar3 = toCharSequence<char_const(&)[15]>((char (*) [15])params_1);
  params_4_00 = (ArrayPtr<const_char> *)AVar3.ptr;
  pBVar2 = *(Branch **)(*params_2 + 8);
  local_38.ptr = (char *)pBVar2;
  if (pBVar2 != (Branch *)0x0) {
    local_38.ptr = *(char **)*params_2;
  }
  local_38.size_ = (size_t)((long)&pBVar2[-1].content.branches.disposer + 7);
  if (pBVar2 == (Branch *)0x0) {
    local_38.size_ = (size_t)(char *)0x0;
  }
  local_48 = toCharSequence<char_const(&)[5]>((char (*) [5])params_3);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_58,&local_68,
             (ArrayPtr<const_char> *)&stack0xffffffffffffff88,&local_38,&local_48,params_4_00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}